

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>::
TPZGeoElRefLess(TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>
                *this,void **vtt,
               TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>
               *gel)

{
  void *pvVar1;
  long lVar2;
  TPZGeoElSide gelside;
  TPZGeoElSide thisside;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,vtt + 1,&gel->super_TPZGeoEl);
  pvVar1 = *vtt;
  *(void **)&this->super_TPZGeoEl = pvVar1;
  *(void **)((long)(&(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoTriangle>.super_TPZGeoTriangle +
                   -2) + *(long *)((long)pvVar1 + -0x60)) = vtt[3];
  pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>::TPZTriangleSphere
            (&this->fGeo,&gel->fGeo);
  lVar2 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar2) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar2) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar2) = 0xffffffffffffffff;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0xa8);
  for (lVar2 = 0; lVar2 != 0xa8; lVar2 = lVar2 + 0x18) {
    TPZGeoElSide::TPZGeoElSide
              (&local_48,
               (TPZGeoElSideIndex *)
               ((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar2),
               (this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::TPZGeoElSide
              (&local_60,
               (TPZGeoElSideIndex *)
               ((long)&gel->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar2),
               (this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::SetConnectivity(&local_48,&local_60);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(const TPZGeoElRefLess<TGeo>  &gel)
:TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(gel), fGeo(gel.fGeo){
	int i;
	for(i=0;i<TGeo::NSides;i++){
		TPZGeoElSide thisside(this->fNeighbours[i], this->Mesh());
		TPZGeoElSide gelside(gel.fNeighbours[i], this->Mesh());
		thisside.SetConnectivity(gelside);
		//     fNeighbours[i].SetConnectivity(gel.fNeighbours[i]);
	}
	//  fSubElement = -1;
}